

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O0

dynhds_entry * entry_append(dynhds_entry *e,char *value,size_t valuelen)

{
  size_t sVar1;
  size_t sVar2;
  dynhds_entry *__dest;
  char *__dest_00;
  char *p;
  size_t valuelen2;
  dynhds_entry *e2;
  size_t valuelen_local;
  char *value_local;
  dynhds_entry *e_local;
  
  sVar2 = e->valuelen + 1 + valuelen;
  e_local = (dynhds_entry *)(*Curl_ccalloc)(1,e->namelen + sVar2 + 0x22);
  if (e_local == (dynhds_entry *)0x0) {
    e_local = (dynhds_entry *)0x0;
  }
  else {
    __dest = e_local + 1;
    e_local->name = (char *)__dest;
    memcpy(__dest,e->name,e->namelen);
    e_local->namelen = e->namelen;
    __dest_00 = (char *)((long)&__dest->name + e->namelen + 1);
    e_local->value = __dest_00;
    memcpy(__dest_00,e->value,e->valuelen);
    sVar1 = e->valuelen;
    __dest_00[sVar1] = ' ';
    memcpy(__dest_00 + sVar1 + 1,value,valuelen);
    e_local->valuelen = sVar2;
  }
  return e_local;
}

Assistant:

static struct dynhds_entry *
entry_append(struct dynhds_entry *e,
             const char *value, size_t valuelen)
{
  struct dynhds_entry *e2;
  size_t valuelen2 = e->valuelen + 1 + valuelen;
  char *p;

  DEBUGASSERT(value);
  e2 = calloc(1, sizeof(*e) + e->namelen + valuelen2 + 2);
  if(!e2)
    return NULL;
  e2->name = p = ((char *)e2) + sizeof(*e2);
  memcpy(p, e->name, e->namelen);
  e2->namelen = e->namelen;
  e2->value = p += e->namelen + 1; /* leave a \0 at the end of name */
  memcpy(p, e->value, e->valuelen);
  p += e->valuelen;
  p[0] = ' ';
  memcpy(p + 1, value, valuelen);
  e2->valuelen = valuelen2;
  return e2;
}